

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_input.cpp
# Opt level: O2

Am_Input_Char
create_input_char_from_code(short code,uint state,Am_Button_Down down,Am_Click_Count mouse)

{
  Am_Input_Char ic;
  Am_Input_Char local_c;
  
  Am_Input_Char::Am_Input_Char
            (&local_c,code,
             (bool)((ushort)(code - 0x61U) < 0x1a & ((byte)state & 2) >> 1 | (byte)state & 1),
             SUB41((state & 4) >> 2,0),SUB41((state & 8) >> 3,0),down,mouse,false);
  return local_c;
}

Assistant:

Am_Input_Char
create_input_char_from_code(short code, unsigned int state, Am_Button_Down down,
                            Am_Click_Count mouse)
{

  bool shft = false;
  bool ctrl = false;
  bool meta = false;

  if ((state & ShiftMask))
    shft = true;

  //only use shift lock for alphabetic characters
  if ((state & LockMask) && (code >= 'a') && (code <= 'z'))
    shft = true;

  if (state & ControlMask)
    ctrl = true;
  if (state & Mod1Mask)
    meta = true;

  Am_Input_Char ic = Am_Input_Char(code, shft, ctrl, meta, down, mouse);

  return ic;
}